

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalRangeJoin::GlobalSortedTable::IntializeMatches(GlobalSortedTable *this)

{
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<bool,_std::default_delete<bool[]>_> local_18;
  
  __p_00 = (pointer)operator_new__((this->count).super___atomic_base<unsigned_long>._M_i);
  local_18._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl =
       (tuple<bool_*,_std::default_delete<bool[]>_>)
       (_Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>)0x0;
  ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
            ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)&this->found_match,__p_00);
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&local_18);
  switchD_004a0b15::default
            ((this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,
             (this->count).super___atomic_base<unsigned_long>._M_i);
  return;
}

Assistant:

void PhysicalRangeJoin::GlobalSortedTable::IntializeMatches() {
	found_match = make_unsafe_uniq_array_uninitialized<bool>(Count());
	memset(found_match.get(), 0, sizeof(bool) * Count());
}